

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void VmExtractOptArgValue
               (jx9_value *pArray,jx9_value *pWorker,char *zArg,char *zArgEnd,int need_val,
               jx9_context *pCtx,char *zName)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  jx9_value *pArray_00;
  bool bVar4;
  jx9_value *pOptArg;
  int d;
  char *zCur;
  jx9_context *pCtx_local;
  int need_val_local;
  char *zArgEnd_local;
  char *zArg_local;
  jx9_value *pWorker_local;
  jx9_value *pArray_local;
  
  jx9_value_bool(pWorker,0);
  if (need_val == 0) {
    jx9_array_add_strkey_elem(pArray,zName,pWorker);
  }
  else {
    zArgEnd_local = zArg + 1;
    if ((zArgEnd_local < zArgEnd) && (*zArgEnd_local == '=')) {
      zArgEnd_local = zArg + 2;
    }
    while( true ) {
      pcVar3 = zArgEnd_local;
      bVar4 = false;
      if ((zArgEnd_local < zArgEnd) && (bVar4 = false, (byte)*zArgEnd_local < 0xc0)) {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)*zArgEnd_local] & 0x2000) != 0;
      }
      if (!bVar4) break;
      zArgEnd_local = zArgEnd_local + 1;
    }
    if ((zArgEnd_local < zArgEnd) && (*zArgEnd_local != '-')) {
      if ((*zArgEnd_local == '\'') || (*zArgEnd_local == '\"')) {
        cVar1 = *zArgEnd_local;
        pcVar3 = zArgEnd_local + 1;
        for (zArgEnd_local = pcVar3;
            (zArgEnd_local < zArgEnd && ((*zArgEnd_local != cVar1 || (zArgEnd_local[-1] == '\\'))));
            zArgEnd_local = zArgEnd_local + 1) {
        }
        jx9_value_string(pWorker,pcVar3,(int)zArgEnd_local - (int)pcVar3);
        if (zArgEnd_local < zArgEnd) {
          zArgEnd_local = zArgEnd_local + 1;
        }
      }
      else {
        while( true ) {
          bVar4 = false;
          if (zArgEnd_local < zArgEnd) {
            ppuVar2 = __ctype_b_loc();
            bVar4 = ((*ppuVar2)[(int)*zArgEnd_local] & 0x2000) == 0;
          }
          if (!bVar4) break;
          zArgEnd_local = zArgEnd_local + 1;
        }
        jx9_value_string(pWorker,pcVar3,(int)zArgEnd_local - (int)pcVar3);
      }
      while( true ) {
        bVar4 = false;
        if ((zArgEnd_local < zArgEnd) && (bVar4 = false, (byte)*zArgEnd_local < 0xc0)) {
          ppuVar2 = __ctype_b_loc();
          bVar4 = ((*ppuVar2)[(int)*zArgEnd_local] & 0x2000) != 0;
        }
        if (!bVar4) break;
        zArgEnd_local = zArgEnd_local + 1;
      }
      if ((zArgEnd_local < zArgEnd) && (*zArgEnd_local != '-')) {
        pArray_00 = jx9_context_new_array(pCtx);
        if (pArray_00 == (jx9_value *)0x0) {
          jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
        }
        else {
          jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pWorker);
          while ((zArgEnd_local < zArgEnd && (*zArgEnd_local != '-'))) {
            pcVar3 = zArgEnd_local;
            if ((zArgEnd_local < zArgEnd) && (*zArgEnd_local == '\\')) {
              zArgEnd_local = zArgEnd_local + 1;
              pcVar3 = zArgEnd_local;
            }
            while( true ) {
              bVar4 = false;
              if (zArgEnd_local < zArgEnd) {
                ppuVar2 = __ctype_b_loc();
                bVar4 = ((*ppuVar2)[(int)*zArgEnd_local] & 0x2000) == 0;
              }
              if (!bVar4) break;
              zArgEnd_local = zArgEnd_local + 1;
            }
            jx9_value_reset_string_cursor(pWorker);
            jx9_value_string(pWorker,pcVar3,(int)zArgEnd_local - (int)pcVar3);
            jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pWorker);
            while( true ) {
              bVar4 = false;
              if ((zArgEnd_local < zArgEnd) && (bVar4 = false, (byte)*zArgEnd_local < 0xc0)) {
                ppuVar2 = __ctype_b_loc();
                bVar4 = ((*ppuVar2)[(int)*zArgEnd_local] & 0x2000) != 0;
              }
              if (!bVar4) break;
              zArgEnd_local = zArgEnd_local + 1;
            }
          }
          jx9_array_add_strkey_elem(pArray,zName,pArray_00);
          jx9_context_release_value(pCtx,pArray_00);
        }
      }
      else {
        jx9_array_add_strkey_elem(pArray,zName,pWorker);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,zName,pWorker);
    }
  }
  return;
}

Assistant:

static void VmExtractOptArgValue(
	jx9_value *pArray,  /* getopt() return value */
	jx9_value *pWorker, /* Worker variable */
	const char *zArg,   /* Argument stream */
	const char *zArgEnd, /* End of the argument stream  */
	int need_val,       /* TRUE to fetch option argument */
	jx9_context *pCtx,  /* Call Context */
	const char *zName   /* Option name */)
{
	jx9_value_bool(pWorker, 0);
	if( !need_val ){
		/* 
		 * Option does not need arguments.
		 * Insert the option name and a boolean FALSE.
		 */
		jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
	}else{
		const char *zCur;
		/* Extract option argument */
		zArg++;
		if( zArg < zArgEnd && zArg[0] == '=' ){
			zArg++;
		}
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg >= zArgEnd || zArg[0] == '-' ){
			/*
			 * Argument not found.
			 * Insert the option name and a boolean FALSE.
			 */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
			return;
		}
		/* Delimit the value */
		zCur = zArg;
		if( zArg[0] == '\'' || zArg[0] == '"' ){
			int d = zArg[0];
			/* Delimt the argument */
			zArg++;
			zCur = zArg;
			while( zArg < zArgEnd ){
				if( zArg[0] == d && zArg[-1] != '\\' ){
					/* Delimiter found, exit the loop  */
					break;
				}
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
			if( zArg < zArgEnd ){ zArg++; }
		}else{
			while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
		}
		/*
		 * Check if we are dealing with multiple values.
		 * If so, create an array to hold them, rather than a scalar variable.
		 */
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg < zArgEnd && zArg[0] != '-' ){
			jx9_value *pOptArg; /* Array of option arguments */
			pOptArg = jx9_context_new_array(pCtx);
			if( pOptArg == 0 ){
				jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			}else{
				/* Insert the first value */
				jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
				for(;;){
					if( zArg >= zArgEnd || zArg[0] == '-' ){
						/* No more value */
						break;
					}
					/* Delimit the value */
					zCur = zArg;
					if( zArg < zArgEnd && zArg[0] == '\\' ){
						zArg++;
						zCur = zArg;
					}
					while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
						zArg++;
					}
					/* Reset the string cursor */
					jx9_value_reset_string_cursor(pWorker);
					/* Save the value */
					jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
					/* Insert */
					jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
					/* Jump trailing white spaces */
					while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
						zArg++;
					}
				}
				/* Insert the option arg array */
				jx9_array_add_strkey_elem(pArray, (const char *)zName, pOptArg); /* Will make it's own copy */
				/* Safely release */
				jx9_context_release_value(pCtx, pOptArg);
			}
		}else{
			/* Single value */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
		}
	}
}